

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

int Gia_ManAreFindBestVar(Gia_ManAre_t *p,Gia_PtrAre_t List)

{
  int iVar1;
  int local_48;
  int local_3c;
  int WeightBest;
  int WeightThis;
  int iVarBest;
  int iVarThis;
  int Count2;
  int Count1;
  int Count0;
  Gia_StaAre_t *pCube;
  Gia_ManAre_t *p_local;
  Gia_PtrAre_t List_local;
  
  WeightBest = -1;
  local_3c = -1;
  for (WeightThis = 0; iVar1 = Gia_ManRegNum(p->pAig), WeightThis < iVar1;
      WeightThis = WeightThis + 1) {
    iVarBest = 0;
    iVarThis = 0;
    Count2 = 0;
    _Count1 = Gia_ManAreSta(p,List);
    while (iVar1 = Gia_StaIsGood(p,_Count1), iVar1 != 0) {
      iVar1 = Gia_StaIsUnused(_Count1);
      if (iVar1 == 0) {
        iVar1 = Gia_StaHasValue0(_Count1,WeightThis);
        if (iVar1 == 0) {
          iVar1 = Gia_StaHasValue1(_Count1,WeightThis);
          if (iVar1 == 0) {
            iVarBest = iVarBest + 1;
          }
          else {
            iVarThis = iVarThis + 1;
          }
        }
        else {
          Count2 = Count2 + 1;
        }
      }
      _Count1 = Gia_StaNext(p,_Count1);
    }
    if ((((Count2 != 0) || (iVarThis != 0)) && ((Count2 != 0 || (iVarBest != 0)))) &&
       ((iVarThis != 0 || (iVarBest != 0)))) {
      if (iVarThis < Count2) {
        local_48 = Count2 - iVarThis;
      }
      else {
        local_48 = iVarThis - Count2;
      }
      local_48 = (Count2 + iVarThis) - local_48;
      if (local_3c < local_48) {
        WeightBest = WeightThis;
        local_3c = local_48;
      }
    }
  }
  if (WeightBest == -1) {
    Gia_ManArePrintListUsed(p,List);
    printf("Error: Best variable not found!!!\n");
    __assert_fail("iVarBest != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                  ,0x378,"int Gia_ManAreFindBestVar(Gia_ManAre_t *, Gia_PtrAre_t)");
  }
  return WeightBest;
}

Assistant:

int Gia_ManAreFindBestVar( Gia_ManAre_t * p, Gia_PtrAre_t List )
{
    Gia_StaAre_t * pCube;
    int Count0, Count1, Count2;
    int iVarThis, iVarBest = -1, WeightThis, WeightBest = -1;
    for ( iVarThis = 0; iVarThis < Gia_ManRegNum(p->pAig); iVarThis++ )
    {
        Count0 = Count1 = Count2 = 0;
        Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, List), pCube )
        {
            if ( Gia_StaIsUnused(pCube) )
                continue;
            if ( Gia_StaHasValue0(pCube, iVarThis) )
                Count0++;
            else if ( Gia_StaHasValue1(pCube, iVarThis) )
                Count1++;
            else
                Count2++;
        }
//        printf( "%4d : %5d  %5d  %5d   Weight = %5d\n", iVarThis, Count0, Count1, Count2, 
//            Count0 + Count1 - (Count0 > Count1 ? Count0 - Count1 : Count1 - Count0) );
        if ( (!Count0 && !Count1) || (!Count0 && !Count2) || (!Count1 && !Count2) )
            continue;
        WeightThis = Count0 + Count1 - (Count0 > Count1 ? Count0 - Count1 : Count1 - Count0);
        if ( WeightBest < WeightThis ) 
        {
            WeightBest = WeightThis;
            iVarBest = iVarThis;
        }
    }
    if ( iVarBest == -1 )
    {
        Gia_ManArePrintListUsed( p, List );
        printf( "Error: Best variable not found!!!\n" );
    }
    assert( iVarBest != -1 );
    return iVarBest;
}